

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode NodeId_encodeBinaryWithEncodingMask(UA_NodeId *src,UA_Byte encoding)

{
  UA_DataType *_;
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar1 = 0x80020000;
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    if (((src->identifier).numeric < 0x10000) && (src->namespaceIndex < 0x100)) {
      if ((src->identifier).numeric < 0x100 && src->namespaceIndex == 0) {
        uVar1 = 0x80080000;
        if (end < pos + 1) {
          uVar2 = 0x80080000;
        }
        else {
          *pos = encoding;
          pos = pos + 1;
          uVar2 = 0;
        }
        if (pos + 1 <= end) {
          *pos = *(UA_Byte *)&src->identifier;
          pos = pos + 1;
          uVar1 = 0;
        }
        goto LAB_0012a186;
      }
      uVar1 = 0x80080000;
      if (end < pos + 1) {
        uVar2 = 0x80080000;
      }
      else {
        *pos = encoding | 1;
        pos = pos + 1;
        uVar2 = 0;
      }
      if (pos + 1 <= end) {
        *pos = (UA_Byte)src->namespaceIndex;
        pos = pos + 1;
        uVar1 = 0;
      }
      uVar1 = uVar1 | uVar2;
      uVar2 = 0x80080000;
      if (end < pos + 2) goto LAB_0012a186;
      *(undefined2 *)pos = *(undefined2 *)&src->identifier;
      pos = pos + 2;
    }
    else {
      uVar1 = 0x80080000;
      if (end < pos + 1) {
        uVar2 = 0x80080000;
      }
      else {
        *pos = encoding | 2;
        pos = pos + 1;
        uVar2 = 0;
      }
      if (pos + 2 <= end) {
        *(UA_UInt16 *)pos = src->namespaceIndex;
        pos = pos + 2;
        uVar1 = 0;
      }
      uVar1 = uVar1 | uVar2;
      uVar2 = 0x80080000;
      if (end < pos + 4) goto LAB_0012a186;
      *(UA_UInt32 *)pos = (src->identifier).numeric;
      pos = pos + 4;
    }
    uVar2 = 0;
LAB_0012a186:
    return uVar1 | uVar2;
  default:
    goto switchD_00129fd4_caseD_1;
  case UA_NODEIDTYPE_STRING:
    if (pos + 1 <= end) {
      bVar3 = encoding | 3;
      goto LAB_0012a0cc;
    }
LAB_0012a07a:
    uVar1 = 0x80080000;
    break;
  case UA_NODEIDTYPE_GUID:
    uVar2 = 0x80080000;
    if (end < pos + 1) {
      uVar1 = 0x80080000;
    }
    else {
      *pos = encoding | 4;
      pos = pos + 1;
      uVar1 = 0;
    }
    _ = (UA_DataType *)(pos + 2);
    if (_ <= end) {
      *(UA_UInt16 *)pos = src->namespaceIndex;
      pos = pos + 2;
      uVar2 = 0;
    }
    uVar2 = uVar2 | uVar1;
    uVar1 = Guid_encodeBinary(&(src->identifier).guid,_);
    goto LAB_0012a118;
  case UA_NODEIDTYPE_BYTESTRING:
    if (end < pos + 1) goto LAB_0012a07a;
    bVar3 = encoding | 5;
LAB_0012a0cc:
    *pos = bVar3;
    pos = pos + 1;
    uVar1 = 0;
  }
  uVar2 = 0x80080000;
  if (pos + 2 <= end) {
    *(UA_UInt16 *)pos = src->namespaceIndex;
    pos = pos + 2;
    uVar2 = 0;
  }
  uVar2 = uVar2 | uVar1;
  uVar1 = Array_encodeBinary((src->identifier).string.data,(src->identifier).string.length,
                             UA_TYPES + 2);
LAB_0012a118:
  uVar1 = uVar1 | uVar2;
switchD_00129fd4_caseD_1:
  return uVar1;
}

Assistant:

static UA_StatusCode
NodeId_encodeBinaryWithEncodingMask(UA_NodeId const *src, UA_Byte encoding) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch (src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(src->identifier.numeric > UA_UINT16_MAX || src->namespaceIndex > UA_BYTE_MAX) {
            encoding |= UA_NODEIDTYPE_NUMERIC_COMPLETE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
            retval |= UInt32_encodeBinary(&src->identifier.numeric, NULL);
        } else if(src->identifier.numeric > UA_BYTE_MAX || src->namespaceIndex > 0) {
            encoding |= UA_NODEIDTYPE_NUMERIC_FOURBYTE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            UA_Byte nsindex = (UA_Byte)src->namespaceIndex;
            retval |= Byte_encodeBinary(&nsindex, NULL);
            UA_UInt16 identifier16 = (UA_UInt16)src->identifier.numeric;
            retval |= UInt16_encodeBinary(&identifier16, NULL);
        } else {
            encoding |= UA_NODEIDTYPE_NUMERIC_TWOBYTE;
            retval |= Byte_encodeBinary(&encoding, NULL);
            UA_Byte identifier8 = (UA_Byte)src->identifier.numeric;
            retval |= Byte_encodeBinary(&identifier8, NULL);
        }
        break;
    case UA_NODEIDTYPE_STRING:
        encoding |= UA_NODEIDTYPE_STRING;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= String_encodeBinary(&src->identifier.string, NULL);
        break;
    case UA_NODEIDTYPE_GUID:
        encoding |= UA_NODEIDTYPE_GUID;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= Guid_encodeBinary(&src->identifier.guid, NULL);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        encoding |= UA_NODEIDTYPE_BYTESTRING;
        retval |= Byte_encodeBinary(&encoding, NULL);
        retval |= UInt16_encodeBinary(&src->namespaceIndex, NULL);
        retval |= ByteString_encodeBinary(&src->identifier.byteString);
        break;
    default:
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    return retval;
}